

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPExternalTransmitter::InjectRTP
          (RTPExternalTransmitter *this,void *data,size_t len,RTPAddress *a)

{
  int iVar1;
  undefined4 extraout_var;
  uint8_t *__dest;
  RTPTime RVar2;
  RTPRawPacket *pack;
  RTPAddress *obj;
  
  if ((this->init == true) && (this->created == true)) {
    iVar1 = (**a->_vptr_RTPAddress)(a,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    obj = (RTPAddress *)CONCAT44(extraout_var,iVar1);
    if (obj != (RTPAddress *)0x0) {
      __dest = (uint8_t *)
               operator_new__(len,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,1);
      if (__dest == (uint8_t *)0x0) {
        RTPDelete<jrtplib::RTPAddress>(obj,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
        return;
      }
      memcpy(__dest,data,len);
      RVar2 = RTPTime::CurrentTime();
      pack = (RTPRawPacket *)
             operator_new(0x38,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0x1b);
      (pack->super_RTPMemoryObject).mgr = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      (pack->super_RTPMemoryObject)._vptr_RTPMemoryObject =
           (_func_int **)&PTR__RTPRawPacket_00144050;
      (pack->receivetime).m_t = RVar2.m_t;
      pack->packetdata = __dest;
      pack->packetdatalength = len;
      pack->senderaddress = obj;
      pack->isrtp = true;
      std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
      push_back(&this->rawpacketlist,&pack);
      RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
    }
  }
  return;
}

Assistant:

void RTPExternalTransmitter::InjectRTP(const void *data, size_t len, const RTPAddress &a)
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return;
	}

	RTPAddress *addr = a.CreateCopy(GetMemoryManager());
	if (addr == 0)
		return;

	uint8_t *datacopy;

	datacopy = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET) uint8_t[len];
	if (datacopy == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		return;
	}
	memcpy(datacopy, data, len);

	RTPTime curtime = RTPTime::CurrentTime();
	RTPRawPacket *pack;

	pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,len,addr,curtime,true,GetMemoryManager());
	if (pack == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		return;
	}
	rawpacketlist.push_back(pack);
	m_abortDesc.SendAbortSignal();

	MAINMUTEX_UNLOCK
}